

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint32_t helper_neon_qabs_s16_aarch64(CPUARMState_conflict *env,uint32_t x)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  
  uVar2 = -(ushort)x;
  if (-1 < (int)(x << 0x10)) {
    uVar2 = (ushort)x;
  }
  iVar3 = (int)x >> 0x10;
  if (iVar3 == -0x8000) {
    (env->vfp).qc[0] = 1;
    uVar1 = 0x7fff0000;
  }
  else {
    uVar1 = -iVar3;
    if (-1 < iVar3) {
      uVar1 = x >> 0x10;
    }
    uVar1 = uVar1 << 0x10;
  }
  return uVar1 | uVar2;
}

Assistant:

uint32_t HELPER(neon_qabs_s16)(CPUARMState *env, uint32_t x)
{
    neon_s16 vec;
    NEON_UNPACK(neon_s16, vec, x);
    DO_QABS16(vec.v1);
    DO_QABS16(vec.v2);
    NEON_PACK(neon_s16, x, vec);
    return x;
}